

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O1

int __thiscall CConsoleNetConnection::Recv(CConsoleNetConnection *this,char *pLine,int MaxLength)

{
  char *dest;
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  uint size;
  byte bVar7;
  ulong uVar8;
  
  if (this->m_State != 4) {
    return 0;
  }
  uVar2 = this->m_BufferOffset;
  lVar6 = (long)(int)uVar2;
  if (lVar6 == 0) {
    return 0;
  }
  dest = this->m_aBuffer;
  bVar7 = this->m_LineEndingDetected;
  uVar4 = 1;
  if (1 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  uVar8 = 0;
  do {
    cVar1 = dest[uVar8];
    if ((cVar1 != '\n') && (cVar1 != '\r')) {
      size = 0;
      uVar4 = uVar8;
      goto LAB_001ca567;
    }
    if ((bVar7 & 1) == 0) {
      this->m_aLineEnding[0] = cVar1;
      if (((long)(uVar8 + 1) < lVar6) &&
         (((cVar1 = this->m_aBuffer[uVar8 + 1], cVar1 == '\r' || (cVar1 == '\n')) &&
          (dest[uVar8] != cVar1)))) {
        this->m_aLineEnding[1] = cVar1;
      }
      this->m_LineEndingDetected = true;
      bVar7 = 1;
    }
    uVar8 = uVar8 + 1;
  } while (uVar4 != uVar8);
  iVar5 = 0;
  goto LAB_001ca54b;
  while( true ) {
    uVar4 = uVar4 + 1;
    size = size + 1;
    if (lVar6 <= (long)uVar4) break;
LAB_001ca567:
    if ((dest[uVar4] == '\n') || (dest[uVar4] == '\r')) {
      if ((int)size < MaxLength) {
        mem_copy(pLine,dest + uVar8,size);
        pLine[(int)size] = '\0';
        str_sanitize_cc(pLine);
        mem_move(dest,dest + uVar4,this->m_BufferOffset - (int)uVar4);
        iVar5 = this->m_BufferOffset - (int)uVar4;
        iVar3 = 1;
        goto LAB_001ca54d;
      }
      break;
    }
  }
  if (uVar8 == 0) {
    return 0;
  }
  mem_move(dest,dest + uVar8,uVar2 - (int)uVar8);
  iVar5 = this->m_BufferOffset - (int)uVar8;
LAB_001ca54b:
  iVar3 = 0;
LAB_001ca54d:
  this->m_BufferOffset = iVar5;
  return iVar3;
}

Assistant:

int CConsoleNetConnection::Recv(char *pLine, int MaxLength)
{
	if(State() == NET_CONNSTATE_ONLINE)
	{
		if(m_BufferOffset)
		{
			// find message start
			int StartOffset = 0;
			while(m_aBuffer[StartOffset] == '\r' || m_aBuffer[StartOffset] == '\n')
			{
				// detect clients line ending format
				if(!m_LineEndingDetected)
				{
					m_aLineEnding[0] = m_aBuffer[StartOffset];
					if(StartOffset+1 < m_BufferOffset && (m_aBuffer[StartOffset+1] == '\r' || m_aBuffer[StartOffset+1] == '\n') &&
						m_aBuffer[StartOffset] != m_aBuffer[StartOffset+1])
						m_aLineEnding[1] = m_aBuffer[StartOffset+1];
					m_LineEndingDetected = true;
				}

				if(++StartOffset >= m_BufferOffset)
				{
					m_BufferOffset = 0;
					return 0;
				}
			}

			// find message end
			int EndOffset = StartOffset;
			while(m_aBuffer[EndOffset] != '\r' && m_aBuffer[EndOffset] != '\n')
			{
				if(++EndOffset >= m_BufferOffset)
				{
					if(StartOffset > 0)
					{
						mem_move(m_aBuffer, m_aBuffer+StartOffset, m_BufferOffset-StartOffset);
						m_BufferOffset -= StartOffset;
					}
					return 0;
				}
			}

			// extract message and update buffer
			if(MaxLength-1 < EndOffset-StartOffset)
			{
				if(StartOffset > 0)
				{
					mem_move(m_aBuffer, m_aBuffer+StartOffset, m_BufferOffset-StartOffset);
					m_BufferOffset -= StartOffset;
				}
				return 0;
			}
			mem_copy(pLine, m_aBuffer+StartOffset, EndOffset-StartOffset);
			pLine[EndOffset-StartOffset] = 0;
			str_sanitize_cc(pLine);
			mem_move(m_aBuffer, m_aBuffer+EndOffset, m_BufferOffset-EndOffset);
			m_BufferOffset -= EndOffset;
			return 1;
		}
	}
	return 0;
}